

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interpolants.cpp
# Opt level: O2

SubproofsUnionFind * __thiscall
Shell::Interpolants::computeSubproofs
          (SubproofsUnionFind *__return_storage_ptr__,Interpolants *this,Unit *refutation,
          SplittingFunction *splittingFunction)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  undefined4 extraout_var;
  VirtualIterator<Kernel::Unit_*> parents;
  Unit *current;
  _Map_base<Kernel::Unit_*,_std::pair<Kernel::Unit_*const,_Kernel::Color>,_std::allocator<std::pair<Kernel::Unit_*const,_Kernel::Color>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Unit_*>,_std::hash<Kernel::Unit_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_130;
  unordered_map<Kernel::Unit_*,_int,_std::hash<Kernel::Unit_*>,_std::equal_to<Kernel::Unit_*>,_std::allocator<std::pair<Kernel::Unit_*const,_int>_>_>
  unitsToSize;
  _Hashtable<Kernel::Unit_*,_std::pair<Kernel::Unit_*const,_int>,_std::allocator<std::pair<Kernel::Unit_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Unit_*>,_std::hash<Kernel::Unit_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_f0;
  ProofIteratorBFSPreOrder it;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  unitsToSize._M_h._M_buckets = &unitsToSize._M_h._M_single_bucket;
  unitsToSize._M_h._M_bucket_count = 1;
  unitsToSize._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  unitsToSize._M_h._M_element_count = 0;
  unitsToSize._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  unitsToSize._M_h._M_rehash_policy._M_next_resize = 0;
  unitsToSize._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_130 = (_Map_base<Kernel::Unit_*,_std::pair<Kernel::Unit_*const,_Kernel::Color>,_std::allocator<std::pair<Kernel::Unit_*const,_Kernel::Color>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Unit_*>,_std::hash<Kernel::Unit_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)splittingFunction;
  ProofIteratorBFSPreOrder::ProofIteratorBFSPreOrder(&it,refutation);
  while( true ) {
    bVar1 = ProofIteratorBFSPreOrder::hasNext(&it);
    if (!bVar1) break;
    current = ProofIteratorBFSPreOrder::next(&it);
    pmVar3 = std::__detail::
             _Map_base<Kernel::Unit_*,_std::pair<Kernel::Unit_*const,_Kernel::Color>,_std::allocator<std::pair<Kernel::Unit_*const,_Kernel::Color>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Unit_*>,_std::hash<Kernel::Unit_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at(local_130,&current);
    if (*pmVar3 == COLOR_LEFT) {
      Kernel::Unit::getParents((Unit *)&parents);
      while( true ) {
        iVar2 = (*(parents._core)->_vptr_IteratorCore[2])();
        if ((char)iVar2 == '\0') break;
        iVar2 = (*(parents._core)->_vptr_IteratorCore[3])();
        std::
        _Hashtable<Kernel::Unit_*,_std::pair<Kernel::Unit_*const,_int>,_std::allocator<std::pair<Kernel::Unit_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Unit_*>,_std::hash<Kernel::Unit_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::_Hashtable(&local_f0,&unitsToSize._M_h);
        merge(this,__return_storage_ptr__,
              (unordered_map<Kernel::Unit_*,_int,_std::hash<Kernel::Unit_*>,_std::equal_to<Kernel::Unit_*>,_std::allocator<std::pair<Kernel::Unit_*const,_int>_>_>
               *)&local_f0,current,(Unit *)CONCAT44(extraout_var,iVar2));
        std::
        _Hashtable<Kernel::Unit_*,_std::pair<Kernel::Unit_*const,_int>,_std::allocator<std::pair<Kernel::Unit_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Unit_*>,_std::hash<Kernel::Unit_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_f0);
      }
      Lib::VirtualIterator<Kernel::Unit_*>::~VirtualIterator(&parents);
    }
  }
  ProofIteratorBFSPreOrder::~ProofIteratorBFSPreOrder(&it);
  std::
  _Hashtable<Kernel::Unit_*,_std::pair<Kernel::Unit_*const,_int>,_std::allocator<std::pair<Kernel::Unit_*const,_int>_>,_std::__detail::_Select1st,_std::equal_to<Kernel::Unit_*>,_std::hash<Kernel::Unit_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&unitsToSize._M_h);
  return __return_storage_ptr__;
}

Assistant:

Interpolants::SubproofsUnionFind Interpolants::computeSubproofs(Unit* refutation, const SplittingFunction& splittingFunction)
    {
        std::unordered_map<Unit*, Unit*> unitsToRepresentative; // maps each unit u1 (belonging to a red subproof) to the representative unit u2 of that subproof
        std::unordered_map<Unit*, int> unitsToSize; // needed for weighted quick-union: for each unit, counts number of elements rooted in that unit

        ProofIteratorBFSPreOrder it(refutation); // traverse the proof in breadth-first pre-order
        while (it.hasNext())
        {
            Unit* current = it.next();

            // standard union-find: if current inference is assigned to A-part of the proof,
            if (splittingFunction.at(current) == COLOR_LEFT)
            {
                // then for each parent inference,
                VirtualIterator<Unit*> parents = current->getParents();
                while (parents.hasNext())
                {
                    Unit* premise = parents.next();

                    // the parent may be from the B-part, this is to induce connectedness over a common parent
                    // (Even then we want to merge, so that this parent appears only once in the final interpolant.)
                    {
                        // merge the subproof of the current inference with the subproof of the parent inference
                        merge(unitsToRepresentative, unitsToSize, current, premise);
                    }
                }
            }
        }

        return unitsToRepresentative;
    }